

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,size_t inst_byte_offset,
          uint32_t block_indent,bool is_in_block)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  const_iterator cVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ostringstream comments;
  ostringstream line;
  undefined1 auStack_398 [4];
  Op local_394;
  long *local_390;
  long local_388;
  long local_380 [2];
  uint32_t *local_370;
  size_t local_368;
  long *local_360;
  long local_358;
  long local_350 [2];
  long *local_340;
  ulong local_338;
  long local_330 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [112];
  char acStack_240 [152];
  long local_1a8 [2];
  ulong auStack_198 [12];
  ios_base local_138 [264];
  
  uVar4 = inst->opcode;
  local_368 = inst_byte_offset;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_394 = (Op)uVar4;
  if ((local_394 == OpLabel & this->nested_indent_) == 1) {
    cVar3 = (char)this->stream_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  puVar1 = &inst->result_id;
  local_370 = puVar1;
  if (inst->result_id == 0) {
    local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_320,(char)this->indent_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,
               CONCAT44(local_320[0]._M_string_length._4_4_,(int)local_320[0]._M_string_length));
  }
  else {
    SetBlue(this,this->stream_);
    local_390 = (long *)CONCAT44(local_390._4_4_,*puVar1);
    if ((this->name_mapper_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->name_mapper_)._M_invoker)
              (local_320,(_Any_data *)&this->name_mapper_,(uint *)&local_390);
    if (this->indent_ != 0) {
      uVar5 = (this->indent_ - (int)local_320[0]._M_string_length) - 3;
      uVar12 = 0;
      if (0 < (int)uVar5) {
        uVar12 = (ulong)uVar5;
      }
      *(ulong *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar12;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"%",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,
               CONCAT44(local_320[0]._M_string_length._4_4_,(int)local_320[0]._M_string_length));
    ResetColor(this,this->stream_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if ((is_in_block & this->nested_indent_) == 1) {
    local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
    std::__cxx11::string::_M_construct
              ((ulong)local_320,(char)block_indent * '\x02' + (local_394 != OpLabel) * '\x02');
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,
               CONCAT44(local_320[0]._M_string_length._4_4_,(int)local_320[0]._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Op",2);
  pcVar6 = spvOpcodeString(local_394);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1f0);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
  }
  uVar4 = inst->num_operands;
  if (uVar4 != 0) {
    lVar15 = 4;
    uVar12 = 0;
    do {
      iVar14 = *(int *)((long)&inst->operands->offset + lVar15);
      if (iVar14 != 3) {
        if (iVar14 == 0) {
          __assert_fail("type != SPV_OPERAND_TYPE_NONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                        ,0x2d6,
                        "void spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl(const spv_parsed_instruction_t &, size_t, uint32_t, bool)"
                       );
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        EmitOperand(this,(ostream *)local_1a8,inst,(uint16_t)uVar12);
        uVar4 = inst->num_operands;
      }
      uVar12 = uVar12 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar12 < uVar4);
  }
  if (this->comment_ != 0) {
    GenerateCommentForDecoratedId(this,inst);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (this->show_byte_offset_ == true) {
    SetGrey(this,(ostream *)local_320);
    lVar15 = *(long *)(local_320[0]._M_dataplus._M_p + -0x18);
    uVar2 = *(undefined4 *)((long)&local_320[0].field_2 + lVar15 + 8);
    if (acStack_240[lVar15 + 1] == '\x01') {
      cVar3 = acStack_240[lVar15];
    }
    else {
      cVar3 = std::ios::widen((char)auStack_398 + (char)lVar15 + 'x');
      acStack_240[lVar15] = cVar3;
      acStack_240[lVar15 + 1] = '\x01';
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
    *(undefined8 *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18))
         = 8;
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    lVar15 = *(long *)(local_320[0]._M_dataplus._M_p + -0x18);
    if (acStack_240[lVar15 + 1] == '\0') {
      std::ios::widen((char)auStack_398 + (char)lVar15 + 'x');
      acStack_240[lVar15 + 1] = '\x01';
    }
    acStack_240[lVar15] = '0';
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    *(undefined4 *)
     ((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) = uVar2;
    lVar15 = *(long *)(local_320[0]._M_dataplus._M_p + -0x18);
    if (acStack_240[lVar15 + 1] == '\0') {
      std::ios::widen((char)auStack_398 + (char)lVar15 + 'x');
      acStack_240[lVar15 + 1] = '\x01';
    }
    acStack_240[lVar15] = cVar3;
    ResetColor(this,(ostream *)local_320);
    pcVar6 = ", ";
  }
  else {
    pcVar6 = "";
  }
  puVar1 = local_370;
  iVar14 = this->comment_;
  if ((undefined2)local_394 == 5 && iVar14 != 0) {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"id %",4);
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    iVar14 = this->comment_;
    pcVar6 = ", ";
  }
  if ((iVar14 != 0) && (*puVar1 != 0)) {
    cVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->id_comments_)._M_h,puVar1);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
      std::__detail::
      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->id_comments_,puVar1);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,(char *)local_390,local_388);
      if (local_390 != local_380) {
        operator_delete(local_390,local_380[0] + 1);
      }
    }
  }
  poVar9 = this->stream_;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_390,local_388);
  if (local_390 != local_380) {
    operator_delete(local_390,local_380[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  lVar15 = local_388;
  if (local_390 != local_380) {
    operator_delete(local_390,local_380[0] + 1);
  }
  if (lVar15 == 0) {
    this->last_instruction_comment_alignment_ = 0;
  }
  else {
    std::__cxx11::stringbuf::str();
    if (local_338 == 0) {
      iVar14 = 0;
    }
    else {
      uVar12 = 0;
      iVar14 = 0;
      do {
        if (*(char *)((long)local_340 + uVar12) == '\x1b') {
          uVar11 = uVar12 + 1;
          if (uVar12 + 1 < local_338) {
            uVar11 = local_338;
          }
          uVar10 = uVar12;
          do {
            uVar12 = uVar11;
            if (uVar11 - 1 == uVar10) break;
            uVar12 = uVar10 + 1;
            lVar15 = uVar10 + 1;
            uVar10 = uVar12;
          } while (*(char *)((long)local_340 + lVar15) != 'm');
        }
        else {
          iVar14 = iVar14 + 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < local_338);
    }
    if (local_340 != local_330) {
      operator_delete(local_340,local_330[0] + 1);
    }
    uVar5 = this->last_instruction_comment_alignment_;
    if (this->last_instruction_comment_alignment_ < iVar14 + 2U) {
      uVar5 = iVar14 + 2U;
    }
    uVar13 = 0x34;
    if (0x31 < uVar5) {
      uVar13 = uVar5 + 3 & 0xfffffffc;
    }
    this->last_instruction_comment_alignment_ = uVar13;
    poVar9 = this->stream_;
    local_390 = local_380;
    std::__cxx11::string::_M_construct((ulong)&local_390,(char)uVar13 - (char)iVar14);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_390,local_388);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_360,local_358);
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if (local_390 != local_380) {
      operator_delete(local_390,local_380[0] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->stream_,"\n",1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void InstructionDisassembler::EmitInstructionImpl(
    const spv_parsed_instruction_t& inst, size_t inst_byte_offset,
    uint32_t block_indent, bool is_in_block) {
  auto opcode = static_cast<spv::Op>(inst.opcode);

  // To better align the comments (if any), write the instruction to a line
  // first so its length can be readily available.
  std::ostringstream line;

  if (nested_indent_ && opcode == spv::Op::OpLabel) {
    // Separate the blocks by an empty line to make them easier to separate
    stream_ << std::endl;
  }

  if (inst.result_id) {
    SetBlue();
    const std::string id_name = name_mapper_(inst.result_id);
    if (indent_)
      line << std::setw(std::max(0, indent_ - 3 - int(id_name.size())));
    line << "%" << id_name;
    ResetColor();
    line << " = ";
  } else {
    line << std::string(indent_, ' ');
  }

  if (nested_indent_ && is_in_block) {
    // Output OpLabel at the specified nest level, and instructions inside
    // blocks nested a little more.
    uint32_t indent = block_indent;
    bool body_indent = opcode != spv::Op::OpLabel;

    line << std::string(
        indent * kBlockNestIndent + (body_indent ? kBlockBodyIndentOffset : 0),
        ' ');
  }

  line << "Op" << spvOpcodeString(opcode);

  for (uint16_t i = 0; i < inst.num_operands; i++) {
    const spv_operand_type_t type = inst.operands[i].type;
    assert(type != SPV_OPERAND_TYPE_NONE);
    if (type == SPV_OPERAND_TYPE_RESULT_ID) continue;
    line << " ";
    EmitOperand(line, inst, i);
  }

  // For the sake of comment generation, store information from some
  // instructions for the future.
  if (comment_) {
    GenerateCommentForDecoratedId(inst);
  }

  std::ostringstream comments;
  const char* comment_separator = "";

  if (show_byte_offset_) {
    SetGrey(comments);
    auto saved_flags = comments.flags();
    auto saved_fill = comments.fill();
    comments << comment_separator << "0x" << std::setw(8) << std::hex
             << std::setfill('0') << inst_byte_offset;
    comments.flags(saved_flags);
    comments.fill(saved_fill);
    ResetColor(comments);
    comment_separator = ", ";
  }

  if (comment_ && opcode == spv::Op::OpName) {
    const spv_parsed_operand_t& operand = inst.operands[0];
    const uint32_t word = inst.words[operand.offset];
    comments << comment_separator << "id %" << word;
    comment_separator = ", ";
  }

  if (comment_ && inst.result_id && id_comments_.count(inst.result_id) > 0) {
    comments << comment_separator << id_comments_[inst.result_id].str();
    comment_separator = ", ";
  }

  stream_ << line.str();

  if (!comments.str().empty()) {
    // Align the comments
    const uint32_t line_length = GetLineLengthWithoutColor(line.str());
    uint32_t align = std::max(
        {line_length + 2, last_instruction_comment_alignment_, kCommentColumn});
    // Round up the alignment to a multiple of 4 for more niceness.
    align = (align + 3) & ~0x3u;
    last_instruction_comment_alignment_ = align;

    stream_ << std::string(align - line_length, ' ') << "; " << comments.str();
  } else {
    last_instruction_comment_alignment_ = 0;
  }

  stream_ << "\n";
}